

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest12InhibitAnyPolicy_::
Section12InvalidSelfIssuedinhibitAnyPolicyTest10<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section12InvalidSelfIssuedinhibitAnyPolicyTest10<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  undefined1 local_d8 [8];
  PkitsTestInfo info;
  char *crls [3];
  char *pcStack_38;
  char *certs [5];
  Section12InvalidSelfIssuedinhibitAnyPolicyTest10<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  certs[3] = "InvalidSelfIssuedinhibitAnyPolicyTest10EE";
  certs[1] = "inhibitAnyPolicy1SelfIssuedCACert";
  certs[2] = "inhibitAnyPolicy1subCA2Cert";
  pcStack_38 = "TrustAnchorRootCertificate";
  certs[0] = "inhibitAnyPolicy1CACert";
  info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)anon_var_dwarf_19793f;
  certs[4] = (char *)this;
  PkitsTestInfo::PkitsTestInfo((PkitsTestInfo *)local_d8);
  local_d8 = (undefined1  [8])0x6f6a9c;
  info.time.year._0_1_ = 0;
  PkitsTestInfo::SetUserConstrainedPolicySet((PkitsTestInfo *)local_d8,"");
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<5ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)this,
             (char *(*) [5])&pcStack_38,
             (char *(*) [3])
             &info.user_constrained_policy_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (PkitsTestInfo *)local_d8);
  PkitsTestInfo::~PkitsTestInfo((PkitsTestInfo *)local_d8);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest12InhibitAnyPolicy,
                     Section12InvalidSelfIssuedinhibitAnyPolicyTest10) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "inhibitAnyPolicy1CACert",
      "inhibitAnyPolicy1SelfIssuedCACert", "inhibitAnyPolicy1subCA2Cert",
      "InvalidSelfIssuedinhibitAnyPolicyTest10EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "inhibitAnyPolicy1CACRL",
                              "inhibitAnyPolicy1subCA2CRL"};
  PkitsTestInfo info;
  info.test_number = "4.12.10";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}